

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthExistSet(uint *pRes,uint *pTruth,int nVars,uint uMask)

{
  uint uVar1;
  uint iVar;
  
  Kit_TruthCopy(pRes,pTruth,nVars);
  uVar1 = 0;
  iVar = 0;
  if (0 < nVars) {
    uVar1 = nVars;
    iVar = 0;
  }
  for (; uVar1 != iVar; iVar = iVar + 1) {
    if ((uMask >> (iVar & 0x1f) & 1) != 0) {
      Kit_TruthExist(pRes,nVars,iVar);
    }
  }
  return;
}

Assistant:

void Kit_TruthExistSet( unsigned * pRes, unsigned * pTruth, int nVars, unsigned uMask )
{
    int v;
    Kit_TruthCopy( pRes, pTruth, nVars );
    for ( v = 0; v < nVars; v++ )
        if ( uMask & (1 << v) )
            Kit_TruthExist( pRes, nVars, v );
}